

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_builder.hpp
# Opt level: O2

void __thiscall
pico_tree::internal::
build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::space_map<std::array<double,2ul>>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,double>,2ul>>
::compute_bounding_box<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::space_map<std::array<double,2ul>>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,double>,2ul>>
           *this,__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,box_type *box)

{
  box_base<pico_tree::internal::box<double,_2UL>_>::fill_inverse_max
            ((box_base<pico_tree::internal::box<double,_2UL>_> *)box);
  for (; begin._M_current < end._M_current; begin._M_current = begin._M_current + 1) {
    box_base<pico_tree::internal::box<double,_2UL>_>::fit
              ((box_base<pico_tree::internal::box<double,_2UL>_> *)box,
               (scalar_type *)((long)*begin._M_current * 0x10 + *(long *)**(undefined8 **)this));
  }
  return;
}

Assistant:

inline void compute_bounding_box(
      RandomAccessIterator_ begin,
      RandomAccessIterator_ end,
      box_type& box) const {
    box.fill_inverse_max();
    for (; begin < end; ++begin) {
      box.fit(space_[*begin]);
    }
  }